

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution::forward_int8(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  char *pcVar4;
  undefined8 *in_RCX;
  Mat *in_RSI;
  long in_RDI;
  float sumfp32_1;
  float scale_in_1;
  char sums8;
  float scale_out;
  float sumfp32;
  float scale_in;
  int w_1;
  int val;
  int k;
  char *sptr;
  Mat m;
  int q;
  char *kptr;
  int sum;
  int j_1;
  int i_1;
  char *outptr;
  int p;
  size_t out_elemsize;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outh;
  int outw;
  Mat bottom_blob_bordered;
  Option opt_g;
  Mat bottom_blob_unbordered;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Option *in_stack_00000648;
  float in_stack_00000654;
  Mat *in_stack_00000658;
  Mat *in_stack_00000660;
  Mat *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  float in_stack_fffffffffffffd3c;
  allocator_type *in_stack_fffffffffffffd40;
  size_type in_stack_fffffffffffffd48;
  Mat *in_stack_fffffffffffffd50;
  float local_240;
  float local_23c;
  float local_238;
  char local_232;
  char local_231;
  undefined4 local_230;
  float local_22c;
  float local_228;
  int local_224;
  int local_220;
  int local_21c;
  char *local_218;
  Option *in_stack_fffffffffffffdf8;
  Mat *in_stack_fffffffffffffe00;
  Mat *in_stack_fffffffffffffe08;
  Convolution *in_stack_fffffffffffffe10;
  int local_1cc;
  char *local_1c8;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  Mat local_1b0;
  float *local_170;
  int local_164;
  ulong local_160;
  int local_154;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  reference local_140;
  vector<int,_std::allocator<int>_> local_130;
  int local_118;
  int local_114;
  int local_110;
  undefined4 local_10c;
  Mat local_108;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined8 local_98;
  Mat local_88;
  int local_48;
  int local_44;
  size_t local_40;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  int local_4;
  
  local_2c = in_RSI->w;
  local_30 = in_RSI->h;
  local_34 = in_RSI->c;
  local_40 = in_RSI->elemsize;
  local_44 = *(int *)(in_RDI + 0xc4) * (*(int *)(in_RDI + 0xbc) + -1) + 1;
  local_48 = *(int *)(in_RDI + 200) * (*(int *)(in_RDI + 0xc0) + -1) + 1;
  local_28 = in_RCX;
  Mat::Mat(&local_88,in_RSI);
  if (local_40 != 1) {
    local_98 = local_28[4];
    local_b8 = *local_28;
    local_a8 = *(undefined4 *)(local_28 + 2);
    uStack_a4 = *(undefined4 *)((long)local_28 + 0x14);
    uStack_a0 = *(undefined4 *)(local_28 + 3);
    uStack_9c = *(undefined4 *)((long)local_28 + 0x1c);
    uStack_b0 = local_28[2];
    quantize_float32_to_int8
              (in_stack_00000660,in_stack_00000658,in_stack_00000654,in_stack_00000648);
  }
  Mat::Mat(&local_108);
  make_padding(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
               in_stack_fffffffffffffdf8);
  bVar2 = Mat::empty(in_stack_fffffffffffffd30);
  if (bVar2) {
    local_4 = -100;
    local_10c = 1;
  }
  else {
    local_2c = local_108.w;
    local_30 = local_108.h;
    local_110 = (local_108.w - local_44) / *(int *)(in_RDI + 0xcc) + 1;
    local_114 = (local_108.h - local_48) / *(int *)(in_RDI + 0xd0) + 1;
    local_118 = *(int *)(in_RDI + 0xbc) * *(int *)(in_RDI + 0xc0);
    std::allocator<int>::allocator((allocator<int> *)0x12e2a3);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd50,
               in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    std::allocator<int>::~allocator((allocator<int> *)0x12e2cc);
    local_140 = std::vector<int,_std::allocator<int>_>::operator[](&local_130,0);
    local_144 = 0;
    local_148 = 0;
    local_14c = local_2c * *(int *)(in_RDI + 200) -
                *(int *)(in_RDI + 0xbc) * *(int *)(in_RDI + 0xc4);
    for (local_150 = 0; local_150 < *(int *)(in_RDI + 0xc0); local_150 = local_150 + 1) {
      for (local_154 = 0; local_154 < *(int *)(in_RDI + 0xbc); local_154 = local_154 + 1) {
        local_140[local_144] = local_148;
        local_144 = local_144 + 1;
        local_148 = *(int *)(in_RDI + 0xc4) + local_148;
      }
      local_148 = local_14c + local_148;
    }
    local_160 = (ulong)(((byte)~*(byte *)(in_RDI + 0x200) & 1) * 3 + 1);
    Mat::create(in_stack_fffffffffffffd50,(int)(in_stack_fffffffffffffd48 >> 0x20),
                (int)in_stack_fffffffffffffd48,(int)((ulong)in_stack_fffffffffffffd40 >> 0x20),
                CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                (Allocator *)in_stack_fffffffffffffd30);
    bVar2 = Mat::empty(in_stack_fffffffffffffd30);
    if (bVar2) {
      local_4 = -100;
    }
    else {
      for (local_164 = 0; local_164 < *(int *)(in_RDI + 0xb8); local_164 = local_164 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                     (int)((ulong)in_stack_fffffffffffffd30 >> 0x20));
        pfVar3 = (float *)Mat::operator_cast_to_signed_char_(&local_1b0);
        Mat::~Mat((Mat *)0x12e52f);
        local_170 = pfVar3;
        for (local_1b4 = 0; local_1b4 < local_114; local_1b4 = local_1b4 + 1) {
          for (local_1b8 = 0; local_1b8 < local_110; local_1b8 = local_1b8 + 1) {
            local_1bc = 0;
            local_1c8 = Mat::operator_cast_to_signed_char_((Mat *)(in_RDI + 0x138));
            local_1c8 = local_1c8 + local_118 * local_34 * local_164;
            for (local_1cc = 0; local_1cc < local_34; local_1cc = local_1cc + 1) {
              Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                           (int)((ulong)in_stack_fffffffffffffd30 >> 0x20));
              local_218 = Mat::row<signed_char>
                                    ((Mat *)&stack0xfffffffffffffdf0,
                                     local_1b4 * *(int *)(in_RDI + 0xd0));
              local_218 = local_218 + local_1b8 * *(int *)(in_RDI + 0xcc);
              for (local_21c = 0; local_21c < local_118; local_21c = local_21c + 1) {
                local_220 = (int)local_218[local_140[local_21c]];
                local_224 = (int)local_1c8[local_21c];
                local_1bc = local_220 * local_224 + local_1bc;
              }
              local_1c8 = local_1c8 + local_118;
              Mat::~Mat((Mat *)0x12e766);
            }
            if ((*(byte *)(in_RDI + 0x200) & 1) == 0) {
              pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x1b8),(long)local_164);
              if ((*pfVar3 != 0.0) || (NAN(*pfVar3))) {
                in_stack_fffffffffffffd3c = *(float *)(in_RDI + 0x1f8);
                in_stack_fffffffffffffd40 =
                     (allocator_type *)Mat::operator[]((Mat *)(in_RDI + 0x1b8),(long)local_164);
                local_238 = 1.0 / (in_stack_fffffffffffffd3c * *(float *)in_stack_fffffffffffffd40);
              }
              else {
                local_238 = 0.0;
              }
              local_23c = (float)local_1bc * local_238;
              if (*(int *)(in_RDI + 0xe8) != 0) {
                in_stack_fffffffffffffd30 =
                     (Mat *)Mat::operator[]((Mat *)(in_RDI + 0x178),(long)local_164);
                local_23c = *(float *)&in_stack_fffffffffffffd30->data + local_23c;
              }
              if (*(int *)(in_RDI + 0xf4) == 1) {
                local_240 = 0.0;
                pfVar3 = std::max<float>(&local_23c,&local_240);
                local_23c = *pfVar3;
              }
              *local_170 = local_23c;
              local_170 = local_170 + 1;
            }
            else {
              pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x1b8),(long)local_164);
              if ((*pfVar3 != 0.0) || (NAN(*pfVar3))) {
                fVar1 = *(float *)(in_RDI + 0x1f8);
                pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x1b8),(long)local_164);
                local_228 = 1.0 / (fVar1 * *pfVar3);
              }
              else {
                local_228 = 0.0;
              }
              local_22c = (float)local_1bc * local_228;
              if (*(int *)(in_RDI + 0xe8) != 0) {
                pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x178),(long)local_164);
                local_22c = *pfVar3 + local_22c;
              }
              local_230 = *(undefined4 *)(in_RDI + 0x1fc);
              local_231 = float2int8(SUB84(in_stack_fffffffffffffd30,0));
              if (*(int *)(in_RDI + 0xf4) == 1) {
                local_232 = '\0';
                pcVar4 = std::max<signed_char>(&local_231,&local_232);
                local_231 = *pcVar4;
              }
              *(char *)local_170 = local_231;
              local_170 = (float *)((long)local_170 + 1);
            }
          }
        }
      }
      local_4 = 0;
    }
    local_10c = 1;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd40);
  }
  Mat::~Mat((Mat *)0x12eb43);
  Mat::~Mat((Mat *)0x12eb50);
  return local_4;
}

Assistant:

int Convolution::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Convolution input %d x %d  ksize=%d %d  stride=%d %d\n", w, h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;

        quantize_float32_to_int8(bottom_blob, bottom_blob_unbordered, bottom_blob_int8_scale, opt_g);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_unbordered, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        signed char* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                int sum = 0;

                const signed char* kptr = (const signed char*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        int val = sptr[ space_ofs[k] ];
                        int w = kptr[k];
                        sum += val * w;
                    }

                    kptr += maxk;
                }

                if (use_int8_requantize)
                {
                    // requantize and relu
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

                    float sumfp32 = sum * scale_in;

                    if (bias_term)
                        sumfp32 += bias_data[p];

                    float scale_out = top_blob_int8_scale;//FIXME load param

                    signed char sums8 = float2int8(sumfp32 * scale_out);

                    if (activation_type == 1)
                    {
                        sums8 = std::max(sums8, (signed char)0);
                    }

                    outptr[0] = sums8;
                    outptr += 1;
                }
                else
                {
                    // dequantize and relu
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

                    float sumfp32 = sum * scale_in;
                    if (bias_term)
                        sumfp32 += bias_data[p];

                    if (activation_type == 1)
                    {
                        sumfp32 = std::max(sumfp32, 0.f);
                    }

                    ((float*)outptr)[0] = sumfp32;
                    outptr += 4;
                }
            }
        }
    }

    return 0;
}